

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue200_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_Test::_Run(_Test_Test *this)

{
  _func_int **pp_Var1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  size_type *psVar4;
  undefined1 auVar5 [16];
  WriteOptions write_options;
  DB *db;
  ReadOptions read_options;
  string dbpath;
  Options options;
  undefined1 local_2a9;
  Status local_2a8;
  undefined8 local_2a0;
  DB *local_298;
  undefined1 local_290 [32];
  Status local_270;
  char *local_268;
  undefined8 local_260;
  string local_258;
  void *local_238;
  void *local_230;
  undefined1 local_228 [24];
  stringstream local_210 [392];
  Options local_88;
  
  test::TmpDir_abi_cxx11_();
  plVar3 = (long *)std::__cxx11::string::append(local_228);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_258.field_2._M_allocated_capacity = *psVar4;
    local_258.field_2._8_8_ = plVar3[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar4;
    local_258._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_258._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((Comparator *)local_228._0_8_ != (Comparator *)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_);
  }
  Options::Options((Options *)local_228);
  DestroyDB((leveldb *)&local_230,&local_258,(Options *)local_228);
  if (local_230 != (void *)0x0) {
    operator_delete__(local_230);
  }
  Options::Options(&local_88);
  local_88.create_if_missing = true;
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x18;
  std::__cxx11::stringstream::stringstream(local_210);
  DB::Open((DB *)local_290,&local_88,&local_258,&local_298);
  test::Tester::IsOk((Tester *)local_228,(Status *)local_290);
  if ((_func_int **)local_290._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_290._0_8_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_2a9 = 0;
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x1b;
  std::__cxx11::stringstream::stringstream(local_210);
  local_290._0_8_ = "1";
  local_290._8_8_ = 1;
  local_268 = "b";
  local_260 = 1;
  (*local_298->_vptr_DB[2])(&local_2a8,local_298,&local_2a9);
  test::Tester::IsOk((Tester *)local_228,&local_2a8);
  if (local_2a8.state_ != (char *)0x0) {
    operator_delete__(local_2a8.state_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x1c;
  std::__cxx11::stringstream::stringstream(local_210);
  local_290._0_8_ = "2";
  local_290._8_8_ = 1;
  local_268 = "c";
  local_260 = 1;
  (*local_298->_vptr_DB[2])(&local_2a8,local_298,&local_2a9);
  test::Tester::IsOk((Tester *)local_228,&local_2a8);
  if (local_2a8.state_ != (char *)0x0) {
    operator_delete__(local_2a8.state_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x1d;
  std::__cxx11::stringstream::stringstream(local_210);
  local_290._0_8_ = "3";
  local_290._8_8_ = 1;
  local_268 = "d";
  local_260 = 1;
  (*local_298->_vptr_DB[2])(&local_2a8,local_298,&local_2a9);
  test::Tester::IsOk((Tester *)local_228,&local_2a8);
  if (local_2a8.state_ != (char *)0x0) {
    operator_delete__(local_2a8.state_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x1e;
  std::__cxx11::stringstream::stringstream(local_210);
  local_290._0_8_ = "4";
  local_290._8_8_ = 1;
  local_268 = "e";
  local_260 = 1;
  (*local_298->_vptr_DB[2])(&local_2a8,local_298,&local_2a9);
  test::Tester::IsOk((Tester *)local_228,&local_2a8);
  if (local_2a8.state_ != (char *)0x0) {
    operator_delete__(local_2a8.state_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x1f;
  std::__cxx11::stringstream::stringstream(local_210);
  local_290._0_8_ = "5";
  local_290._8_8_ = 1;
  local_268 = "f";
  local_260 = 1;
  (*local_298->_vptr_DB[2])(&local_2a8,local_298,&local_2a9);
  test::Tester::IsOk((Tester *)local_228,&local_2a8);
  if (local_2a8.state_ != (char *)0x0) {
    operator_delete__(local_2a8.state_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_268 = (char *)CONCAT62(local_268._2_6_,0x100);
  local_260 = 0;
  iVar2 = (*local_298->_vptr_DB[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x25;
  std::__cxx11::stringstream::stringstream(local_210);
  local_290._0_8_ = "25";
  local_290._8_8_ = 2;
  local_2a8.state_ = "cd";
  local_2a0 = 2;
  (*local_298->_vptr_DB[2])(&local_270,local_298,&local_2a9);
  test::Tester::IsOk((Tester *)local_228,&local_270);
  if (local_270.state_ != (char *)0x0) {
    operator_delete__(local_270.state_);
  }
  test::Tester::~Tester((Tester *)local_228);
  local_228._0_8_ = "5";
  local_228._8_8_ = (char *)0x1;
  (**(code **)(*plVar3 + 0x28))(plVar3,local_228);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x28;
  std::__cxx11::stringstream::stringstream(local_210);
  auVar5 = (**(code **)(*plVar3 + 0x40))(plVar3);
  pp_Var1 = (_func_int **)(local_290 + 0x10);
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,auVar5._0_8_,auVar5._8_8_ + auVar5._0_8_);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            ((Tester *)local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
             (char (*) [2])0x1241a8);
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    operator_delete((void *)local_290._0_8_);
  }
  test::Tester::~Tester((Tester *)local_228);
  (**(code **)(*plVar3 + 0x38))(plVar3);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x2a;
  std::__cxx11::stringstream::stringstream(local_210);
  auVar5 = (**(code **)(*plVar3 + 0x40))(plVar3);
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,auVar5._0_8_,auVar5._8_8_ + auVar5._0_8_);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            ((Tester *)local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
             (char (*) [2])"4");
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    operator_delete((void *)local_290._0_8_);
  }
  test::Tester::~Tester((Tester *)local_228);
  (**(code **)(*plVar3 + 0x38))(plVar3);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x2c;
  std::__cxx11::stringstream::stringstream(local_210);
  auVar5 = (**(code **)(*plVar3 + 0x40))(plVar3);
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,auVar5._0_8_,auVar5._8_8_ + auVar5._0_8_);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            ((Tester *)local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
             (char (*) [2])"3");
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    operator_delete((void *)local_290._0_8_);
  }
  test::Tester::~Tester((Tester *)local_228);
  (**(code **)(*plVar3 + 0x30))(plVar3);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x2e;
  std::__cxx11::stringstream::stringstream(local_210);
  auVar5 = (**(code **)(*plVar3 + 0x40))(plVar3);
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,auVar5._0_8_,auVar5._8_8_ + auVar5._0_8_);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            ((Tester *)local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
             (char (*) [2])"4");
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    operator_delete((void *)local_290._0_8_);
  }
  test::Tester::~Tester((Tester *)local_228);
  (**(code **)(*plVar3 + 0x30))(plVar3);
  local_228[0] = 1;
  local_228._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
  ;
  local_228._16_4_ = 0x30;
  std::__cxx11::stringstream::stringstream(local_210);
  auVar5 = (**(code **)(*plVar3 + 0x40))(plVar3);
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,auVar5._0_8_,auVar5._8_8_ + auVar5._0_8_);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            ((Tester *)local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
             (char (*) [2])0x1241a8);
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    operator_delete((void *)local_290._0_8_);
  }
  test::Tester::~Tester((Tester *)local_228);
  (**(code **)(*plVar3 + 8))(plVar3);
  if (local_298 != (DB *)0x0) {
    (*local_298->_vptr_DB[1])();
  }
  DestroyDB((leveldb *)&local_238,&local_258,&local_88);
  if (local_238 != (void *)0x0) {
    operator_delete__(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Issue200, Test) {
  // Get rid of any state from an old run.
  std::string dbpath = test::TmpDir() + "/leveldb_issue200_test";
  DestroyDB(dbpath, Options());

  DB* db;
  Options options;
  options.create_if_missing = true;
  ASSERT_OK(DB::Open(options, dbpath, &db));

  WriteOptions write_options;
  ASSERT_OK(db->Put(write_options, "1", "b"));
  ASSERT_OK(db->Put(write_options, "2", "c"));
  ASSERT_OK(db->Put(write_options, "3", "d"));
  ASSERT_OK(db->Put(write_options, "4", "e"));
  ASSERT_OK(db->Put(write_options, "5", "f"));

  ReadOptions read_options;
  Iterator* iter = db->NewIterator(read_options);

  // Add an element that should not be reflected in the iterator.
  ASSERT_OK(db->Put(write_options, "25", "cd"));

  iter->Seek("5");
  ASSERT_EQ(iter->key().ToString(), "5");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "3");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "5");

  delete iter;
  delete db;
  DestroyDB(dbpath, options);
}